

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O3

int kget_int32(kstring_t *k,size_t *pos,int32_t *val_p)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  int *in_RCX;
  kstring_t *pkVar4;
  kstring_t *pkVar5;
  uint uVar6;
  
  pkVar4 = *(kstring_t **)val_p;
  uVar6 = 1;
  if (pkVar4 < k) {
    while ((cVar2 = *(char *)((long)pos + (long)pkVar4), cVar2 == ' ' || (cVar2 == '\t'))) {
      pkVar4 = (kstring_t *)((long)&pkVar4->l + 1);
      if (k == pkVar4) {
        return -1;
      }
    }
    pkVar4 = (kstring_t *)((long)&pkVar4->l + (ulong)(cVar2 == '-'));
    uVar6 = -(uint)(cVar2 == '-') | 1;
  }
  iVar3 = -1;
  if ((pkVar4 < k) && ((byte)(*(char *)((long)pos + (long)pkVar4) - 0x30U) < 10)) {
    iVar3 = 0;
    do {
      pbVar1 = (byte *)((long)pos + (long)pkVar4);
      pkVar5 = pkVar4;
      if (9 < (byte)(*pbVar1 - 0x30)) break;
      pkVar4 = (kstring_t *)((long)&pkVar4->l + 1);
      iVar3 = (uint)*pbVar1 + iVar3 * 10 + -0x30;
      pkVar5 = k;
    } while (k != pkVar4);
    *(kstring_t **)val_p = pkVar5;
    *in_RCX = iVar3 * uVar6;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int kget_int32(kstring_t *k, size_t *pos, int32_t *val_p) {
    int sign = 1;
    int32_t val = 0;
    size_t p = *pos;

    while (p < k->l && (k->s[p] == ' ' || k->s[p] == '\t'))
	   p++;

    if (p < k->l && k->s[p] == '-')
	sign = -1, p++;

    if (p >= k->l || !(k->s[p] >= '0' && k->s[p] <= '9'))
	return -1;

    while (p < k->l && k->s[p] >= '0' && k->s[p] <= '9')
	val = val*10 + k->s[p++]-'0';
    
    *pos = p;
    *val_p = sign*val;

    return 0;
}